

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O3

void uavs3d_ipred_ang_xy_13_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  long lVar1;
  undefined1 auVar2 [16];
  pel *ppVar3;
  uint uVar4;
  uint uVar5;
  pel *ppVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar27 [32];
  undefined1 auVar31 [32];
  
  auVar2 = _DAT_00183f90;
  uVar4 = 7;
  if (height < 7) {
    uVar4 = height;
  }
  if (height < 1) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    uVar11 = 1;
    auVar17._16_16_ = _DAT_00183f90;
    auVar17._0_16_ = _DAT_00183f90;
    auVar29._8_2_ = 0x40;
    auVar29._0_8_ = 0x40004000400040;
    auVar29._10_2_ = 0x40;
    auVar29._12_2_ = 0x40;
    auVar29._14_2_ = 0x40;
    do {
      iVar7 = uVar5 * -0x403fffc;
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + uVar5 * 0x400 + 0x1c3c2004;
      auVar19._4_4_ = iVar7;
      auVar19._0_4_ = iVar7;
      auVar19._8_4_ = iVar7;
      auVar19._12_4_ = iVar7;
      auVar21._16_4_ = iVar7;
      auVar21._0_16_ = auVar19;
      auVar21._20_4_ = iVar7;
      auVar21._24_4_ = iVar7;
      auVar21._28_4_ = iVar7;
      if (width < 5) {
        lVar16 = -(ulong)(uVar5 >> 3);
        uVar9 = 0;
      }
      else {
        uVar8 = uVar11 >> 3;
        uVar12 = 0;
        do {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)(src + uVar12 + (3 - uVar8));
          auVar25._8_8_ = 0;
          auVar25._0_8_ = *(ulong *)(src + uVar12 + (-1 - uVar8));
          auVar24._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar25;
          auVar24._16_16_ = ZEXT116(1) * auVar22;
          auVar24 = vpshufb_avx2(auVar24,auVar17);
          auVar24 = vpmaddubsw_avx2(auVar24,auVar21);
          auVar22 = vphaddw_avx(auVar24._0_16_,auVar24._16_16_);
          auVar22 = vpaddw_avx(auVar22,auVar29);
          auVar22 = vpsrlw_avx(auVar22,7);
          auVar22 = vpackuswb_avx(auVar22,auVar22);
          *(long *)(dst + uVar12) = auVar22._0_8_;
          uVar9 = uVar12 + 8;
          lVar16 = uVar12 + 0xc;
          uVar12 = uVar9;
        } while (lVar16 < width);
        lVar16 = uVar9 - uVar8;
      }
      if ((int)uVar9 < width) {
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(src + lVar16 + -1);
        auVar22 = vpshufb_avx(auVar23,auVar2);
        auVar19 = vpmaddubsw_avx(auVar22,auVar19);
        auVar19 = vphaddw_avx(auVar19,auVar19);
        auVar19 = vpaddw_avx(auVar19,auVar29);
        auVar19 = vpsrlw_avx(auVar19,7);
        auVar19 = vpackuswb_avx(auVar19,auVar19);
        *(int *)(dst + (uVar9 & 0xffffffff)) = auVar19._0_4_;
      }
      dst = dst + i_dst;
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar4);
  }
  auVar2 = _DAT_00183f90;
  if (width == 4) {
    if ((int)uVar4 < height) {
      uVar9 = (ulong)uVar4;
      ppVar6 = src + (8 - uVar9);
      uVar11 = uVar9;
      do {
        uVar11 = uVar11 + 1;
        uVar9 = uVar9 + 1;
        iVar7 = (int)((double)(int)uVar9 * 0.125 + 0.9999);
        uVar4 = iVar7 - 1;
        uVar12 = 4;
        if ((int)uVar4 < 4) {
          uVar12 = (ulong)uVar4;
        }
        uVar8 = 0;
        if (iVar7 < 2) {
LAB_001313e4:
          uVar5 = (int)uVar9 * 4 & 0x1c;
          lVar16 = (long)(int)uVar4 - (uVar11 >> 3 & 0x1fffffff);
          lVar15 = 0;
          do {
            dst[lVar15 + uVar8] =
                 (pel)((uint)src[lVar15 + lVar16] * (uVar5 + 0x20) +
                       (uint)src[lVar15 + lVar16 + 1] * (0x40 - uVar5) +
                       (uint)src[lVar15 + lVar16 + 2] * (0x20 - uVar5) +
                       src[lVar15 + lVar16 + -1] * uVar5 + 0x40 >> 7);
            lVar15 = lVar15 + 1;
          } while (4 - uVar8 != lVar15);
        }
        else {
          uVar8 = 0;
          do {
            dst[uVar8] = (pel)((uint)ppVar6[uVar8 * 8 + -2] + (uint)ppVar6[uVar8 * 8 + -1] * 2 +
                               (uint)ppVar6[uVar8 * 8] + 2 >> 2);
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
          uVar8 = uVar12;
          if ((int)uVar4 < 4) goto LAB_001313e4;
        }
        dst = dst + i_dst;
        ppVar6 = ppVar6 + -1;
      } while (uVar9 != (uint)height);
    }
  }
  else if ((int)uVar4 < height) {
    lVar16 = (long)width;
    uVar9 = (ulong)uVar4;
    ppVar6 = src + (8 - uVar9);
    auVar18._16_16_ = _DAT_00183f90;
    auVar18._0_16_ = _DAT_00183f90;
    auVar20._8_2_ = 0x40;
    auVar20._0_8_ = 0x40004000400040;
    auVar20._10_2_ = 0x40;
    auVar20._12_2_ = 0x40;
    auVar20._14_2_ = 0x40;
    uVar11 = uVar9;
    do {
      uVar11 = uVar11 + 1;
      uVar9 = uVar9 + 1;
      iVar7 = (int)((double)(int)uVar9 * 0.125 + 0.9999);
      uVar4 = iVar7 - 1;
      uVar12 = (ulong)uVar4;
      if (width <= (int)uVar4) {
        uVar12 = (ulong)(uint)width;
      }
      iVar13 = (int)uVar12;
      if (0 < iVar13) {
        uVar8 = 0;
        do {
          dst[uVar8] = (pel)((uint)ppVar6[uVar8 * 8 + -2] + (uint)ppVar6[uVar8 * 8 + -1] * 2 +
                             (uint)ppVar6[uVar8 * 8] + 2 >> 2);
          uVar8 = uVar8 + 1;
        } while (uVar12 != uVar8);
      }
      lVar15 = (long)iVar7;
      uVar5 = (int)uVar9 * 4 & 0x1c;
      uVar4 = (0x20 - uVar5) * 0x1000000 | (0x40 - uVar5) * 0x10000 | (uVar5 + 0x20) * 0x100 | uVar5
      ;
      auVar26._4_4_ = uVar4;
      auVar26._0_4_ = uVar4;
      auVar26._8_4_ = uVar4;
      auVar26._12_4_ = uVar4;
      auVar27._16_4_ = uVar4;
      auVar27._0_16_ = auVar26;
      auVar27._20_4_ = uVar4;
      auVar27._24_4_ = uVar4;
      auVar27._28_4_ = uVar4;
      if (iVar13 + 7 < width) {
        lVar14 = lVar15 + -1;
        if (lVar16 <= lVar15 + -1) {
          lVar14 = lVar16;
        }
        lVar15 = lVar15 - (uVar11 >> 3 & 0x1fffffff);
        lVar10 = 0;
        do {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(src + lVar10 + lVar15 + 2);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(src + lVar10 + lVar15 + -2);
          auVar31._0_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar32;
          auVar31._16_16_ = ZEXT116(1) * auVar28;
          auVar17 = vpshufb_avx2(auVar31,auVar18);
          auVar17 = vpmaddubsw_avx2(auVar17,auVar27);
          auVar29 = vphaddw_avx(auVar17._0_16_,auVar17._16_16_);
          auVar29 = vpaddw_avx(auVar29,auVar20);
          auVar29 = vpsrlw_avx(auVar29,7);
          auVar29 = vpackuswb_avx(auVar29,auVar29);
          *(long *)(dst + lVar10 + lVar14) = auVar29._0_8_;
          lVar1 = lVar14 + lVar10;
          lVar10 = lVar10 + 8;
        } while (lVar1 < lVar16 + -0xf);
        iVar13 = (int)lVar14 + (int)lVar10;
        lVar15 = lVar10 + lVar15 + -1;
      }
      else {
        lVar15 = (lVar15 + -1) - (uVar9 >> 3 & 0x1fffffff);
      }
      ppVar3 = src + lVar15;
      if (iVar13 + 3 < width) {
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(ppVar3 + -1);
        auVar29 = vpshufb_avx(auVar30,auVar2);
        auVar29 = vpmaddubsw_avx(auVar29,auVar26);
        auVar29 = vphaddw_avx(auVar29,auVar29);
        auVar29 = vpaddw_avx(auVar29,auVar20);
        auVar29 = vpsrlw_avx(auVar29,7);
        auVar29 = vpackuswb_avx(auVar29,auVar29);
        *(int *)(dst + iVar13) = auVar29._0_4_;
        iVar13 = iVar13 + 4;
        ppVar3 = ppVar3 + 4;
      }
      if (iVar13 < width) {
        lVar15 = 0;
        do {
          dst[lVar15 + iVar13] =
               (pel)((uint)ppVar3[lVar15] * (uVar5 + 0x20) +
                     (uint)ppVar3[lVar15 + 1] * (0x40 - uVar5) +
                     (uint)ppVar3[lVar15 + 2] * (0x20 - uVar5) + ppVar3[lVar15 + -1] * uVar5 + 0x40
                    >> 7);
          lVar15 = lVar15 + 1;
        } while (lVar16 - iVar13 != lVar15);
      }
      dst = dst + i_dst;
      ppVar6 = ppVar6 + -1;
    } while (uVar9 != (uint)height);
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_xy_13_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    int i, j;
    pel *psrc = src;
    int step1_height = COM_MIN(height, 7);

    __m256i shuffle_x = _mm256_setr_epi8(0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6, 0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6);
    __m128i c_64 = _mm_set1_epi16(64);

    for (j = 0; j < step1_height; j++) {
        int d = j + 1;
        pel *px = src - (d >> 3);
        int offsetx = (d << 2) & 0x1f;
        int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
        __m256i coeff_x = _mm256_set1_epi32(offsetx + (c << 8) + (b << 16) + (a << 24));

        for (i = 0; i + 4 < width; i += 8, px += 8) {
            IPRED_ANG_XY_X8(px, shuffle_x, coeff_x, c_64, 7, dst + i)
        }
        if (i < width) {
            IPRED_ANG_XY_X4(px, _mm256_castsi256_si128(shuffle_x), _mm256_castsi256_si128(coeff_x), c_64, 7, dst + i)
        }
        dst += i_dst;
    }

    if (width == 4) {
        for (; j < height; j++) {
            int d = j + 1;
            int step1_width = (int)(((j + 1) / 8.0 + 0.9999)) - 1;
            int offsetx = (d << 2) & 0x1f;
            int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
            pel *px = src + step1_width - (d >> 3);
            pel *py = psrc - j + 8;

            step1_width = COM_MIN(step1_width, width);

            for (i = 0; i < step1_width; i++, py += 8) {
                dst[i] = (py[-2] + (py[-1] << 1) + py[0] + 2) >> 2;
            }
            for (; i < width; i++, px++) {
                dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
            }
            dst += i_dst;
        }
    }
    else {
        for (; j < height; j++) {
            int d = j + 1;
            int step1_width = (int)(((j + 1) / 8.0 + 0.9999)) - 1;
            int offsetx = (d << 2) & 0x1f;
            int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
            pel *px = src + step1_width - (d >> 3);
            pel *py = psrc - j + 8;
            __m256i coeff_x = _mm256_set1_epi32(offsetx + (c << 8) + (b << 16) + (a << 24));

            step1_width = COM_MIN(step1_width, width);

            for (i = 0; i < step1_width; i++, py += 8) {
                dst[i] = (py[-2] + (py[-1] << 1) + py[0] + 2) >> 2;
            }

            for (i = step1_width; i + 7 < width; i += 8, px += 8) {
                IPRED_ANG_XY_X8(px, shuffle_x, coeff_x, c_64, 7, dst + i)
            }
            if (i + 3 < width) {
                IPRED_ANG_XY_X4(px, _mm256_castsi256_si128(shuffle_x), _mm256_castsi256_si128(coeff_x), c_64, 7, dst + i)
                    i += 4;
                px += 4;
            }
            for (; i < width; i++, px++) {
                dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
            }
            dst += i_dst;
        }
    }
}